

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_algorithm_suite.cpp
# Opt level: O2

void copy_suite::remove_copy(void)

{
  basic_iterator<int> __first;
  basic_iterator<int> __last;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> second_begin;
  initializer_list<int> input;
  initializer_list<int> __l;
  iterator first_begin;
  iterator first_end;
  back_insert_iterator<vista::circular_view<int,_18446744073709551615UL>_> in_stack_ffffffffffffff18
  ;
  view_pointer in_stack_ffffffffffffff20;
  size_type in_stack_ffffffffffffff28;
  _Iter_equals_val<const_int> in_stack_ffffffffffffff30;
  view_pointer in_stack_ffffffffffffff38;
  size_type in_stack_ffffffffffffff40;
  vector<int,_std::allocator<int>_> expect;
  int local_94 [3];
  circular_view<int,_18446744073709551615UL> copy;
  int copy_array [4];
  int array [4];
  circular_view<int,_18446744073709551615UL> span;
  
  span.member.data = array;
  span.member.cap = 4;
  span.member.size = 0;
  array[0] = 0;
  array[1] = 0;
  array[2] = 0;
  array[3] = 0;
  span.member.next = 4;
  copy.member.data = (pointer)0x160000000b;
  copy.member.cap = 0x2c00000021;
  copy.member.size = CONCAT44(copy.member.size._4_4_,0x37);
  input._M_len = 5;
  input._M_array = (iterator)&copy;
  vista::circular_view<int,_18446744073709551615UL>::assign(&span,input);
  copy.member.data = copy_array;
  copy.member.cap = 4;
  copy.member.size = 0;
  copy.member.next = 4;
  vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  vista::circular_view<int,_18446744073709551615UL>::end(&span);
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 0x21;
  __first.current = in_stack_ffffffffffffff28;
  __first.parent = in_stack_ffffffffffffff20;
  __last.current = in_stack_ffffffffffffff40;
  __last.parent = in_stack_ffffffffffffff38;
  std::
  __remove_copy_if<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,std::back_insert_iterator<vista::circular_view<int,18446744073709551615ul>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
            (__first,__last,in_stack_ffffffffffffff18,in_stack_ffffffffffffff30);
  local_94[0] = 0x16;
  local_94[1] = 0x2c;
  __l._M_len = 3;
  __l._M_array = local_94;
  local_94[2] = 0x37;
  std::vector<int,_std::allocator<int>_>::vector
            (&expect,__l,(allocator_type *)&stack0xffffffffffffff3f);
  first_begin = vista::circular_view<int,_18446744073709551615UL>::begin(&copy);
  first_end = vista::circular_view<int,_18446744073709551615UL>::end(&copy);
  second_begin._M_current._4_4_ =
       expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       ._4_4_;
  second_begin._M_current._0_4_ =
       expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       ._0_4_;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0x9c,"void copy_suite::remove_copy()",first_begin,first_end,second_begin,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&expect.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void remove_copy()
{
    int array[4] = {};
    circular_view<int> span(array);
    span = { 11, 22, 33, 44, 55 };
    int copy_array[4];
    circular_view<int> copy(copy_array);
    std::remove_copy(span.begin(), span.end(), std::back_inserter(copy), 33);
    {
        std::vector<int> expect = { 22, 44, 55 };
        BOOST_TEST_ALL_EQ(copy.begin(), copy.end(),
                          expect.begin(), expect.end());
    }
}